

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

string * __thiscall
vkt::SpirVAssembly::getAssemblyTypeDeclaration_abi_cxx11_
          (string *__return_storage_ptr__,SpirVAssembly *this,NumberType type)

{
  allocator<char> *__a;
  int iVar1;
  char *__s;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  iVar1 = (int)this;
  if (iVar1 == 2) {
    __s = "OpTypeFloat 32";
    __a = &local_b;
  }
  else if (iVar1 == 1) {
    __s = "OpTypeInt 32 0";
    __a = &local_a;
  }
  else if (iVar1 == 0) {
    __s = "OpTypeInt 32 1";
    __a = &local_9;
  }
  else {
    __s = "";
    __a = &local_c;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

const string getAssemblyTypeDeclaration (const NumberType type)
{
	switch (type)
	{
		case TYPE_INT:		return "OpTypeInt 32 1";
		case TYPE_UINT:		return "OpTypeInt 32 0";
		case TYPE_FLOAT:	return "OpTypeFloat 32";
		default:			DE_ASSERT(false); return "";
	}
}